

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManPrintTents_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int Entry;
  
  for (; (pGVar1 = p->pObjs, pGVar1 <= pObj && (pObj < pGVar1 + p->nObjs));
      pObj = pObj + -(ulong)((uint)(*(ulong *)pObj >> 0x20) & 0x1fffffff)) {
    Entry = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= Entry) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[Entry] == p->nTravIds) {
      return;
    }
    p->pTravIds[Entry] = p->nTravIds;
    if (pGVar1 + p->nObjs <= pObj) break;
    Vec_IntPush(vObjs,Entry);
    if ((~(uint)*(ulong *)pObj & 0x9fffffff) == 0) {
      return;
    }
    Gia_ManPrintTents_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vObjs);
    uVar2 = (uint)*(ulong *)pObj;
    if ((int)uVar2 < 0) {
      return;
    }
    if ((uVar2 & 0x1fffffff) == 0x1fffffff) {
      return;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManPrintTents_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    Vec_IntPush( vObjs, Gia_ObjId(p, pObj) );
    if ( Gia_ObjIsCi(pObj) )
        return;
    Gia_ManPrintTents_rec( p, Gia_ObjFanin0(pObj), vObjs );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManPrintTents_rec( p, Gia_ObjFanin1(pObj), vObjs );
}